

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_ptr.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  weak_ptr<int> weak;
  shared_ptr<int> shared;
  __weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined4 local_3c;
  __weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_38;
  __weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_28;
  __weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_68._M_ptr = (element_type *)0x0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  poVar1 = std::operator<<((ostream *)&std::cout,"weak_ptr<> not yet initialized.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr(&local_18,&local_68);
  observe((weak_ptr<int> *)&local_18);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_18._M_refcount);
  local_3c = 0x2a;
  std::make_shared<int,int>((int *)&local_50);
  std::__weak_ptr<int,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_68,&local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,"weak_ptr<> initialized with shared_ptr.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr(&local_28,&local_68);
  observe((weak_ptr<int> *)&local_28);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "shared_ptr<> has been destructed due to scope exit.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr(&local_38,&local_68);
  observe((weak_ptr<int> *)&local_38);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_68._M_refcount);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::weak_ptr<int> weak;
	std::cout << "weak_ptr<> not yet initialized." << std::endl;
	observe(weak);

	{
		auto shared = std::make_shared<int>(42);
		weak = shared;
		std::cout << "weak_ptr<> initialized with shared_ptr." << std::endl;
		observe(weak);
	}

	std::cout << "shared_ptr<> has been destructed due to scope exit." << std::endl;
	observe(weak);

	return 0;
}